

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

Abc_Des_t * Io_MvParse(Io_MvMan_t *p)

{
  undefined4 uVar1;
  Io_MvMod_t *p_00;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Str_t *pVVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  Io_MvMan_t *pIVar7;
  Abc_Des_t *pAVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  byte *pbVar14;
  Abc_Obj_t *pAVar15;
  ulong uVar16;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  Mio_Gate_t *pMVar21;
  Mio_Library_t *pMVar22;
  Mio_Gate_t *pMVar23;
  Abc_Ntk_t *pAVar24;
  Abc_Obj_t *pAVar25;
  Abc_Obj_t *pAVar26;
  Vec_Ptr_t *pVVar27;
  uint *puVar28;
  void *pvVar29;
  void **ppvVar30;
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  byte *pbVar34;
  ulong uVar35;
  byte bVar36;
  char *pCur;
  Mem_Flex_t *pMVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  char *pcVar42;
  long lVar43;
  int iVar44;
  bool bVar45;
  ulong uVar46;
  char **pNamesIn;
  size_t __size;
  int iVar47;
  double dVar48;
  
  pVVar27 = p->vModels;
  if (0 < pVVar27->nSize) {
    lVar41 = 0;
    do {
      p_00 = (Io_MvMod_t *)pVVar27->pArray[lVar41];
      if (0 < p_00->vMvs->nSize) {
        Abc_NtkStartMvVars(p_00->pNtk);
      }
      pVVar27 = p_00->vMvs;
      if (0 < pVVar27->nSize) {
        lVar43 = 0;
        do {
          pbVar34 = (byte *)pVVar27->pArray[lVar43];
          bVar31 = *pbVar34;
          if (bVar31 == 0) {
            iVar44 = 0;
          }
          else {
            iVar44 = 0;
            pbVar14 = pbVar34;
            do {
              pbVar14 = pbVar14 + 1;
              iVar44 = iVar44 + (uint)(bVar31 == 0x2c);
              bVar31 = *pbVar14;
            } while (bVar31 != 0);
          }
          pVVar27 = p_00->pMan->vTokens;
          pbVar14 = pbVar34;
LAB_002cef48:
          uVar16 = (ulong)*pbVar14;
          if (0x20 < uVar16) {
LAB_002cef72:
            bVar31 = 0;
LAB_002cef59:
            if (!(bool)(*pbVar14 != 0x2c & (bVar31 ^ 1))) {
              *pbVar14 = 0;
            }
            pbVar14 = pbVar14 + 1;
            goto LAB_002cef48;
          }
          bVar31 = 1;
          if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_002cef59;
          if (uVar16 != 0) goto LAB_002cef72;
          Io_MvCollectTokens(pVVar27,(char *)pbVar34,(char *)pbVar14);
          iVar11 = pVVar27->nSize;
          if (iVar11 < 1) goto LAB_002d1149;
          ppvVar30 = pVVar27->pArray;
          pcVar18 = (char *)*ppvVar30;
          iVar9 = strcmp(pcVar18,"mv");
          if (iVar9 != 0) {
            __assert_fail("!strcmp(pName, \"mv\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x611,"int Io_MvParseLineMv(Io_MvMod_t *, char *)");
          }
          if (iVar11 <= (int)(iVar44 + 2U)) {
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d0d39;
            uVar35 = 0;
            goto LAB_002d0c36;
          }
          if (iVar44 < -2) goto LAB_002d1149;
          uVar10 = atoi((char *)ppvVar30[iVar44 + 2U]);
          uVar16 = (ulong)uVar10;
          if (uVar10 - 0x101 < 0xffffff01) {
            pIVar7 = p_00->pMan;
            uVar33 = (ulong)pIVar7->vLines->nSize;
            uVar35 = 0xffffffff;
            if ((long)uVar33 < 1) goto LAB_002d0d4b;
            uVar46 = 0;
            goto LAB_002d0c79;
          }
          iVar9 = iVar44 + 3;
          if ((uVar10 != 2) || (iVar11 != iVar9)) {
            uVar32 = iVar11 - iVar9;
            if ((uVar32 != 0 && iVar9 <= iVar11) && (uVar32 != uVar10)) {
              pIVar7 = p_00->pMan;
              uVar33 = (ulong)pIVar7->vLines->nSize;
              uVar35 = 0xffffffff;
              if ((long)uVar33 < 1) goto LAB_002d0da7;
              uVar46 = 0;
              goto LAB_002d0cbc;
            }
            pVVar3 = p_00->pNtk->vAttrs;
            if (pVVar3->nSize < 0xd) goto LAB_002d1149;
            pvVar29 = pVVar3->pArray[0xc];
            if (pvVar29 == (void *)0x0) {
              pMVar37 = (Mem_Flex_t *)0x0;
            }
            else {
              pMVar37 = *(Mem_Flex_t **)((long)pvVar29 + 0x10);
            }
            uVar33 = 0;
            do {
              uVar33 = uVar33 + 1;
              if ((long)pVVar27->nSize <= (long)uVar33) goto LAB_002d1149;
              pAVar15 = Abc_NtkFindOrCreateNet(p_00->pNtk,(char *)pVVar27->pArray[uVar33]);
              puVar28 = (uint *)Mem_FlexEntryFetch(pMVar37,0x10);
              *puVar28 = uVar10;
              puVar28[2] = 0;
              puVar28[3] = 0;
              if (iVar9 < pVVar27->nSize) {
                pcVar18 = Mem_FlexEntryFetch(pMVar37,uVar10 * 8);
                *(char **)(puVar28 + 2) = pcVar18;
                if (iVar9 < pVVar27->nSize) {
                  lVar39 = 0;
                  do {
                    pcVar18 = (char *)pVVar27->pArray[iVar9 + lVar39];
                    sVar20 = strlen(pcVar18);
                    pcVar19 = Mem_FlexEntryFetch(pMVar37,(int)sVar20 + 1);
                    *(char **)(*(long *)(puVar28 + 2) + lVar39 * 8) = pcVar19;
                    strcpy(*(char **)(*(long *)(puVar28 + 2) + lVar39 * 8),pcVar18);
                    lVar40 = iVar9 + lVar39;
                    lVar39 = lVar39 + 1;
                  } while (lVar40 + 1 < (long)pVVar27->nSize);
                }
              }
              pVVar3 = pAVar15->pNtk->vAttrs;
              if (pVVar3->nSize < 0xd) goto LAB_002d1149;
              piVar2 = (int *)pVVar3->pArray[0xc];
              if (*(void **)(piVar2 + 2) == (void *)0x0) {
                __assert_fail("p->pArrayPtr",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                              ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
              }
              if (*(long *)(piVar2 + 8) != 0) {
                __assert_fail("p->pFuncStartObj == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                              ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
              }
              iVar11 = pAVar15->Id;
              iVar13 = *piVar2;
              if (iVar13 <= iVar11) {
                iVar47 = iVar11 + 10;
                if (iVar11 < iVar13 * 2) {
                  iVar47 = iVar13 * 2;
                }
                if (iVar13 < iVar47) {
                  pvVar29 = realloc(*(void **)(piVar2 + 2),(long)iVar47 * 8);
                  *(void **)(piVar2 + 2) = pvVar29;
                  memset((void *)((long)pvVar29 + (long)*piVar2 * 8),0,
                         ((long)iVar47 - (long)*piVar2) * 8);
                  *piVar2 = iVar47;
                }
              }
              *(uint **)(*(long *)(piVar2 + 2) + (long)iVar11 * 8) = puVar28;
            } while (uVar33 != iVar44 + 1);
            if ((0 < (int)uVar10) && (lVar39 = *(long *)(puVar28 + 2), lVar39 != 0)) {
              lVar40 = lVar39;
              uVar33 = uVar16;
              uVar35 = 0;
              do {
                uVar46 = uVar35 + 1;
                if (uVar46 < uVar16) {
                  pcVar18 = *(char **)(lVar39 + uVar35 * 8);
                  uVar35 = 1;
                  do {
                    iVar44 = strcmp(pcVar18,*(char **)(lVar40 + uVar35 * 8));
                    if (iVar44 == 0) {
                      if (pVVar27->nSize < 1) goto LAB_002d1149;
                      pVVar3 = p_00->pMan->vLines;
                      pcVar19 = p_00->pMan->sError;
                      uVar16 = (ulong)pVVar3->nSize;
                      uVar33 = 0xffffffff;
                      if ((long)uVar16 < 1) goto LAB_002d0b35;
                      uVar35 = 0;
                      goto LAB_002d0b23;
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar33 != uVar35);
                }
                uVar33 = uVar33 - 1;
                lVar40 = lVar40 + 8;
                uVar35 = uVar46;
              } while (uVar46 != uVar16);
            }
          }
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vMvs;
        } while (lVar43 < pVVar27->nSize);
      }
      iVar44 = p_00->vResets->nSize;
      if (0 < iVar44) {
        if (p_00->vLatches->nSize != iVar44) {
          uVar16 = (ulong)p->vLines->nSize;
          uVar33 = 0xffffffff;
          if ((long)uVar16 < 1) goto LAB_002d0f4a;
          uVar35 = 0;
          goto LAB_002d0e2f;
        }
        if (p->fUseReset != 0) {
          pAVar15 = Io_ReadCreateResetLatch(p_00->pNtk,p->fBlifMv);
          p_00->pResetLatch = pAVar15;
        }
      }
      pVVar27 = p_00->vFlops;
      if (0 < pVVar27->nSize) {
        lVar43 = 0;
        do {
          if (p_00->pMan->fBlifMv != 0) {
            __assert_fail("!p->pMan->fBlifMv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x4ff,"int Io_MvParseLineFlop(Io_MvMod_t *, char *)");
          }
          pVVar3 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokens(pVVar3,(char *)pVVar27->pArray[lVar43],'\0');
          uVar10 = pVVar3->nSize;
          if ((int)uVar10 < 1) goto LAB_002d1149;
          ppvVar30 = pVVar3->pArray;
          pcVar18 = (char *)*ppvVar30;
          iVar44 = strcmp(pcVar18,"flop");
          if (iVar44 != 0) {
            __assert_fail("!strcmp(pToken, \"flop\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x502,"int Io_MvParseLineFlop(Io_MvMod_t *, char *)");
          }
          uVar16 = 0;
          do {
            pcVar19 = (char *)ppvVar30[uVar16];
            if ((*pcVar19 == 'Q') && (pcVar19[1] == '=')) goto LAB_002cf341;
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
          uVar16 = (ulong)uVar10;
LAB_002cf341:
          if ((uint)uVar16 == uVar10) {
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d0cd5;
            uVar35 = 0;
            goto LAB_002d0b72;
          }
          uVar16 = (ulong)uVar10;
          if ((int)uVar10 < 2) {
            uVar16 = 1;
          }
          uVar33 = 0;
          do {
            pcVar42 = (char *)ppvVar30[uVar33];
            if ((*pcVar42 == 'D') && (pcVar42[1] == '=')) {
              uVar16 = uVar33 & 0xffffffff;
              break;
            }
            uVar33 = uVar33 + 1;
          } while (uVar16 != uVar33);
          if ((uint)uVar16 == uVar10) {
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d0ce0;
            uVar35 = 0;
            goto LAB_002d0bb0;
          }
          pAVar15 = Io_ReadCreateLatch(p_00->pNtk,pcVar42 + 2,pcVar19 + 2);
          iVar44 = pVVar3->nSize;
          if ((long)iVar44 < 1) {
            bVar36 = 0;
            bVar31 = 0;
          }
          else {
            ppvVar30 = pVVar3->pArray;
            lVar39 = 0;
            do {
              pcVar18 = (char *)ppvVar30[lVar39];
              iVar11 = strncmp(pcVar18,"init=",5);
              if (iVar11 == 0) {
                bVar31 = pcVar18[5];
                if ((byte)(bVar31 - 0x30) < 3) {
                  bVar36 = 1 >> (bVar31 & 7);
                  goto LAB_002cf3f2;
                }
                pVVar27 = p_00->pMan->vLines;
                pcVar19 = p_00->pMan->sError;
                uVar16 = (ulong)pVVar27->nSize;
                uVar33 = 0xffffffff;
                if ((long)uVar16 < 1) goto LAB_002d0e48;
                uVar35 = 0;
                goto LAB_002d0d15;
              }
              lVar39 = lVar39 + 1;
            } while (iVar44 != lVar39);
            bVar36 = 0;
            bVar31 = 0;
          }
LAB_002cf3f2:
          uVar10 = *(uint *)&pAVar15->field_0x14 & 0xf;
          if (bVar36 == 0) {
            if ((bVar31 & 1) == 0) {
              aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
              if (uVar10 != 8) goto LAB_002d1241;
            }
            else {
              aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
              if (uVar10 != 8) goto LAB_002d1260;
            }
          }
          else {
            aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            if (uVar10 != 8) goto LAB_002d11a6;
          }
          pAVar15->field_5 = aVar17;
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vFlops;
        } while (lVar43 < pVVar27->nSize);
      }
      pVVar27 = p_00->vLatches;
      if (0 < pVVar27->nSize) {
        lVar43 = 0;
        do {
          pVVar3 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokens(pVVar3,(char *)pVVar27->pArray[lVar43],'\0');
          iVar44 = pVVar3->nSize;
          if (iVar44 < 1) goto LAB_002d1149;
          ppvVar30 = pVVar3->pArray;
          pcVar18 = (char *)*ppvVar30;
          iVar11 = strcmp(pcVar18,"latch");
          if (iVar11 != 0) {
            __assert_fail("!strcmp(pToken, \"latch\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x4bd,"int Io_MvParseLineLatch(Io_MvMod_t *, char *)");
          }
          if (iVar44 < 3) {
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d0d2e;
            uVar35 = 0;
            goto LAB_002d0bf3;
          }
          if (p_00->pResetLatch == (Abc_Obj_t *)0x0) {
            pAVar15 = Io_ReadCreateLatch(p_00->pNtk,(char *)ppvVar30[1],(char *)ppvVar30[2]);
            if (p_00->pMan->fBlifMv == 0) {
              if (6 < pVVar3->nSize) {
                pVVar27 = p_00->pMan->vLines;
                lVar39 = (long)pVVar27->nSize;
                if (0 < lVar39) {
                  lVar40 = 0;
                  do {
                    if (pcVar18 < pVVar27->pArray[lVar40]) break;
                    lVar40 = lVar40 + 1;
                  } while (lVar39 != lVar40);
                }
                printf(
                      "Warning: Line %d has .latch directive with unrecognized entries (the total of %d entries).\n"
                      );
              }
              iVar44 = pVVar3->nSize;
              uVar10 = 2;
              if (3 < (long)iVar44) {
                uVar10 = atoi((char *)pVVar3->pArray[(long)iVar44 + -1]);
              }
              if (3 < uVar10) {
                pVVar27 = p_00->pMan->vLines;
                uVar16 = (ulong)pVVar27->nSize;
                uVar33 = 0xffffffff;
                if ((long)uVar16 < 1) goto LAB_002d0f25;
                uVar35 = 0;
                goto LAB_002d0def;
              }
              uVar32 = *(uint *)&pAVar15->field_0x14 & 0xf;
              if (uVar10 == 1) {
                aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
                if (uVar32 != 8) {
LAB_002d1260:
                  __assert_fail("Abc_ObjIsLatch(pLatch)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                                ,0x1a4,"void Abc_LatchSetInit1(Abc_Obj_t *)");
                }
              }
              else {
                if (uVar10 == 0) goto LAB_002cf54d;
                aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
                if (uVar32 != 8) {
LAB_002d1241:
                  __assert_fail("Abc_ObjIsLatch(pLatch)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                                ,0x1a5,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
                }
              }
            }
            else {
              uVar32 = *(uint *)&pAVar15->field_0x14 & 0xf;
LAB_002cf54d:
              aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              if (uVar32 != 8) goto LAB_002d11a6;
            }
          }
          else {
            pAVar15 = Abc_NtkFindOrCreateNet(p_00->pNtk,(char *)ppvVar30[2]);
            pAVar24 = p_00->pNtk;
            pcVar18 = Abc_ObjNameSuffix(pAVar15,"_out");
            pAVar15 = Abc_NtkFindOrCreateNet(pAVar24,pcVar18);
            if (pVVar3->nSize < 2) goto LAB_002d1149;
            pAVar24 = p_00->pNtk;
            pcVar18 = (char *)pVVar3->pArray[1];
            pcVar19 = Abc_ObjName(pAVar15);
            pAVar15 = Io_ReadCreateLatch(pAVar24,pcVar18,pcVar19);
            if ((*(uint *)&pAVar15->field_0x14 & 0xf) != 8) {
LAB_002d11a6:
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                            ,0x1a3,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            aVar17 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          }
          pAVar15->field_5 = aVar17;
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vLatches;
        } while (lVar43 < pVVar27->nSize);
      }
      if ((p->fUseReset != 0) && (pVVar27 = p_00->vResets, 0 < pVVar27->nSize)) {
        lVar43 = 0;
        do {
          iVar44 = Io_MvParseLineNamesMv(p_00,(char *)pVVar27->pArray[lVar43],1);
          if (iVar44 == 0) {
            return (Abc_Des_t *)0x0;
          }
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vResets;
        } while (lVar43 < pVVar27->nSize);
      }
      pVVar27 = p_00->vNames;
      if (p->fBlifMv == 0) {
        if (0 < pVVar27->nSize) {
          lVar43 = 0;
LAB_002cf6b5:
          if (p_00->pMan->fBlifMv != 0) {
            __assert_fail("!p->pMan->fBlifMv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x81e,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
          }
          pVVar3 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokens(pVVar3,(char *)pVVar27->pArray[lVar43],'\0');
          iVar44 = pVVar3->nSize;
          if ((long)iVar44 < 1) goto LAB_002d1149;
          ppvVar30 = pVVar3->pArray;
          pcVar18 = (char *)*ppvVar30;
          iVar11 = strcmp(pcVar18,"gate");
          if (iVar11 != 0) {
            iVar11 = strcmp(pcVar18,"names");
            if (iVar11 != 0) {
              __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x824,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
            }
            pcVar18 = (char *)ppvVar30[(long)iVar44 + -1];
            pAVar15 = Abc_NtkFindOrCreateNet(p_00->pNtk,pcVar18);
            if ((pAVar15->vFanins).nSize < 1) {
              pAVar15 = Io_ReadCreateNode(p_00->pNtk,pcVar18,(char **)(pVVar3->pArray + 1),
                                          pVVar3->nSize + -2);
              sVar20 = strlen(pcVar18);
              uVar10 = (pAVar15->vFanins).nSize;
              pIVar7 = p_00->pMan;
              pVVar27 = pIVar7->vTokens;
              pVVar4 = pIVar7->vFunc;
              pIVar7->nTablesRead = pIVar7->nTablesRead + 1;
              Io_MvSplitIntoTokens(pVVar27,pcVar18 + sVar20,'.');
              uVar32 = pVVar27->nSize;
              if (uVar32 == 1) {
                pbVar34 = (byte *)*pVVar27->pArray;
                bVar31 = *pbVar34;
                if ((((bVar31 - 0x30 < 2) || (bVar31 == 0x78)) || (bVar31 == 0x6e)) &&
                   (pbVar34[1] == 0)) {
                  pMVar37 = (Mem_Flex_t *)p_00->pNtk->pManFunc;
                  if (bVar31 == 0x30) goto LAB_002cf7b3;
                  pcVar18 = Abc_SopCreateConst1(pMVar37);
                  goto LAB_002cfdbc;
                }
                pIVar7 = p_00->pMan;
                uVar16 = (ulong)pIVar7->vLines->nSize;
                uVar33 = 0xffffffff;
                if (0 < (long)uVar16) {
                  uVar35 = 0;
                  do {
                    if (pbVar34 < pIVar7->vLines->pArray[uVar35]) {
                      uVar33 = uVar35 & 0xffffffff;
                      break;
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar16 != uVar35);
                }
                pcVar18 = "Line %d: Constant table has wrong output value \"%s\".";
                goto LAB_002cfd9c;
              }
              if (uVar32 == 0) {
                pMVar37 = (Mem_Flex_t *)p_00->pNtk->pManFunc;
LAB_002cf7b3:
                pcVar18 = Abc_SopCreateConst0(pMVar37);
                goto LAB_002cfdbc;
              }
              if (0 < (int)uVar32) {
                if ((uVar32 & 1) == 0) {
                  pVVar4->nSize = 0;
                  if (uVar32 != 1) {
                    uVar38 = 0xffffffff;
                    lVar39 = 0;
                    do {
                      if (((long)(int)uVar32 <= lVar39 * 2) ||
                         (uVar16 = lVar39 * 2 | 1, (long)(int)uVar32 <= (long)uVar16))
                      goto LAB_002d1149;
                      pbVar14 = (byte *)pVVar27->pArray[lVar39 * 2];
                      pbVar34 = (byte *)pVVar27->pArray[uVar16];
                      sVar20 = strlen((char *)pbVar14);
                      if (sVar20 != uVar10) {
                        pIVar7 = p_00->pMan;
                        uVar16 = (ulong)pIVar7->vLines->nSize;
                        uVar33 = 0xffffffff;
                        if ((long)uVar16 < 1) goto LAB_002cff49;
                        uVar35 = 0;
                        goto LAB_002cfea7;
                      }
                      bVar31 = *pbVar34;
                      if ((((1 < bVar31 - 0x30) && (bVar31 != 0x78)) && (bVar31 != 0x6e)) ||
                         (pbVar34[1] != 0)) {
                        pIVar7 = p_00->pMan;
                        uVar16 = (ulong)pIVar7->vLines->nSize;
                        uVar33 = 0xffffffff;
                        if ((long)uVar16 < 1) goto LAB_002cff2a;
                        uVar35 = 0;
                        goto LAB_002cfe36;
                      }
                      uVar12 = (uint)(bVar31 == 0x78 || bVar31 == 0x31);
                      uVar32 = uVar12;
                      if ((uVar38 != 0xffffffff) && (uVar32 = uVar38, uVar38 != uVar12)) {
                        pIVar7 = p_00->pMan;
                        uVar16 = (ulong)pIVar7->vLines->nSize;
                        uVar33 = 0xffffffff;
                        if ((long)uVar16 < 1) goto LAB_002cff8b;
                        uVar35 = 0;
                        goto LAB_002cfeec;
                      }
                      uVar38 = uVar32;
                      sVar20 = strlen((char *)pbVar14);
                      if (0 < (int)(uint)sVar20) {
                        uVar16 = 0;
                        do {
                          bVar31 = pbVar14[uVar16];
                          uVar32 = pVVar4->nCap;
                          if (pVVar4->nSize == uVar32) {
                            if ((int)uVar32 < 0x10) {
                              if (pVVar4->pArray == (char *)0x0) {
                                pcVar18 = (char *)malloc(0x10);
                              }
                              else {
                                pcVar18 = (char *)realloc(pVVar4->pArray,0x10);
                              }
                              __size = 0x10;
                            }
                            else {
                              __size = (ulong)uVar32 * 2;
                              if ((int)__size <= (int)uVar32) goto LAB_002cfbbe;
                              if (pVVar4->pArray == (char *)0x0) {
                                pcVar18 = (char *)malloc(__size);
                              }
                              else {
                                pcVar18 = (char *)realloc(pVVar4->pArray,__size);
                              }
                            }
                            pVVar4->pArray = pcVar18;
                            pVVar4->nCap = (int)__size;
                          }
LAB_002cfbbe:
                          iVar44 = pVVar4->nSize;
                          pVVar4->nSize = iVar44 + 1;
                          pVVar4->pArray[iVar44] = bVar31;
                          uVar16 = uVar16 + 1;
                        } while (((uint)sVar20 & 0x7fffffff) != uVar16);
                      }
                      uVar32 = pVVar4->nCap;
                      if (pVVar4->nSize == uVar32) {
                        if ((int)uVar32 < 0x10) {
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,0x10);
                          }
                          sVar20 = 0x10;
                        }
                        else {
                          sVar20 = (ulong)uVar32 * 2;
                          if ((int)sVar20 <= (int)uVar32) goto LAB_002cfc48;
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(sVar20);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,sVar20);
                          }
                        }
                        pVVar4->pArray = pcVar18;
                        pVVar4->nCap = (int)sVar20;
                      }
LAB_002cfc48:
                      iVar44 = pVVar4->nSize;
                      pVVar4->nSize = iVar44 + 1;
                      pVVar4->pArray[iVar44] = ' ';
                      bVar31 = *pbVar34;
                      uVar32 = pVVar4->nCap;
                      if (pVVar4->nSize == uVar32) {
                        if ((int)uVar32 < 0x10) {
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,0x10);
                          }
                          sVar20 = 0x10;
                        }
                        else {
                          sVar20 = (ulong)uVar32 * 2;
                          if ((int)sVar20 <= (int)uVar32) goto LAB_002cfcbc;
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(sVar20);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,sVar20);
                          }
                        }
                        pVVar4->pArray = pcVar18;
                        pVVar4->nCap = (int)sVar20;
                      }
LAB_002cfcbc:
                      iVar44 = pVVar4->nSize;
                      pVVar4->nSize = iVar44 + 1;
                      pVVar4->pArray[iVar44] = bVar31;
                      uVar32 = pVVar4->nCap;
                      if (pVVar4->nSize == uVar32) {
                        if ((int)uVar32 < 0x10) {
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,0x10);
                          }
                          sVar20 = 0x10;
                        }
                        else {
                          sVar20 = (ulong)uVar32 * 2;
                          if ((int)sVar20 <= (int)uVar32) goto LAB_002cfd2e;
                          if (pVVar4->pArray == (char *)0x0) {
                            pcVar18 = (char *)malloc(sVar20);
                          }
                          else {
                            pcVar18 = (char *)realloc(pVVar4->pArray,sVar20);
                          }
                        }
                        pVVar4->pArray = pcVar18;
                        pVVar4->nCap = (int)sVar20;
                      }
LAB_002cfd2e:
                      iVar44 = pVVar4->nSize;
                      pVVar4->nSize = iVar44 + 1;
                      pVVar4->pArray[iVar44] = '\n';
                      lVar39 = lVar39 + 1;
                      uVar32 = pVVar27->nSize;
                    } while (lVar39 < (int)uVar32 / 2);
                  }
                  uVar10 = pVVar4->nCap;
                  if (pVVar4->nSize == uVar10) {
                    if ((int)uVar10 < 0x10) {
                      if (pVVar4->pArray == (char *)0x0) {
                        pcVar18 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar18 = (char *)realloc(pVVar4->pArray,0x10);
                      }
                      pVVar4->pArray = pcVar18;
                      sVar20 = 0x10;
                    }
                    else {
                      sVar20 = (ulong)uVar10 * 2;
                      if ((int)sVar20 <= (int)uVar10) goto LAB_002cff6d;
                      if (pVVar4->pArray == (char *)0x0) {
                        pcVar18 = (char *)malloc(sVar20);
                      }
                      else {
                        pcVar18 = (char *)realloc(pVVar4->pArray,sVar20);
                      }
                      pVVar4->pArray = pcVar18;
                    }
                    pVVar4->nCap = (int)sVar20;
                  }
LAB_002cff6d:
                  iVar44 = pVVar4->nSize;
                  pVVar4->nSize = iVar44 + 1;
                  pVVar4->pArray[iVar44] = '\0';
                  pcVar18 = pVVar4->pArray;
                  goto LAB_002cfdbc;
                }
                pVVar3 = p_00->pMan->vLines;
                uVar16 = (ulong)pVVar3->nSize;
                uVar33 = 0xffffffff;
                if (0 < (long)uVar16) {
                  uVar35 = 0;
                  do {
                    if (*pVVar27->pArray < pVVar3->pArray[uVar35]) {
                      uVar33 = uVar35 & 0xffffffff;
                      break;
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar16 != uVar35);
                }
                sprintf(p_00->pMan->sError,"Line %d: Table has odd number of tokens (%d).",uVar33);
                goto LAB_002cfdba;
              }
              goto LAB_002d1149;
            }
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d0f67;
            uVar35 = 0;
            goto LAB_002d0f13;
          }
          pMVar22 = (Mio_Library_t *)Abc_FrameReadLibGen();
          if (pMVar22 != (Mio_Library_t *)0x0) {
            if (1 < pVVar3->nSize) {
              pMVar23 = Mio_LibraryReadGateByName(pMVar22,(char *)pVVar3->pArray[1],(char *)0x0);
              if (pMVar23 != (Mio_Gate_t *)0x0) {
                pAVar24 = p_00->pNtk;
                if (pAVar24->nObjCounts[7] == 0) {
                  if (pAVar24->ntkFunc != ABC_FUNC_SOP) {
                    __assert_fail("p->pNtk->ntkFunc == ABC_FUNC_SOP",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                                  ,0x8e1,"int Io_MvParseLineGateBlif(Io_MvMod_t *, Vec_Ptr_t *)");
                  }
                  pAVar24->ntkFunc = ABC_FUNC_MAP;
                  Mem_FlexStop((Mem_Flex_t *)pAVar24->pManFunc,0);
                  p_00->pNtk->pManFunc = pMVar22;
                }
                pMVar21 = Mio_GateReadTwin(pMVar23);
                iVar44 = Io_ReadBlifReorderFormalNames(pVVar3,pMVar23,pMVar21);
                if (iVar44 != 0) {
                  iVar44 = pVVar3->nSize;
                  if (2 < (long)iVar44) {
                    lVar39 = 2;
                    do {
                      ppvVar30 = pVVar3->pArray;
                      pcVar19 = (char *)ppvVar30[lVar39];
                      if (pcVar19 != (char *)0x0) {
                        sVar20 = strlen(pcVar19);
                        if (0 < (int)(uint)sVar20) {
                          uVar16 = (ulong)((uint)sVar20 & 0x7fffffff);
                          do {
                            pcVar42 = pcVar19 + 1;
                            if (*pcVar19 == '=') goto LAB_002cf8a4;
                            uVar16 = uVar16 - 1;
                            pcVar19 = pcVar42;
                          } while (uVar16 != 0);
                        }
                        pcVar42 = (char *)0x0;
LAB_002cf8a4:
                        ppvVar30[lVar39] = pcVar42;
                        if (pVVar3->pArray[lVar39] == (void *)0x0) {
                          pVVar27 = p_00->pMan->vLines;
                          pcVar19 = p_00->pMan->sError;
                          uVar16 = (ulong)pVVar27->nSize;
                          uVar33 = 0xffffffff;
                          if ((long)uVar16 < 1) goto LAB_002d0ee4;
                          uVar35 = 0;
                          goto LAB_002d0d8e;
                        }
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar39 != iVar44);
                  }
                  pMVar21 = Mio_GateReadTwin(pMVar23);
                  ppvVar30 = pVVar3->pArray;
                  pNamesIn = (char **)(ppvVar30 + 2);
                  iVar44 = pVVar3->nSize;
                  if (pMVar21 == (Mio_Gate_t *)0x0) {
                    pAVar15 = Io_ReadCreateNode(p_00->pNtk,(char *)ppvVar30[(long)iVar44 + -1],
                                                pNamesIn,iVar44 + -3);
                    (pAVar15->field_5).pData = pMVar23;
                  }
                  else {
                    if ((char *)ppvVar30[(long)iVar44 + -2] == (char *)0x0) {
                      if (ppvVar30[(long)iVar44 + -1] == (void *)0x0) {
                        __assert_fail("ppNames[nNames] != NULL || ppNames[nNames+1] != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                                      ,0x907,"int Io_MvParseLineGateBlif(Io_MvMod_t *, Vec_Ptr_t *)"
                                     );
                      }
                    }
                    else {
                      pAVar15 = Io_ReadCreateNode(p_00->pNtk,(char *)ppvVar30[(long)iVar44 + -2],
                                                  pNamesIn,iVar44 + -4);
                      (pAVar15->field_5).pData = pMVar23;
                    }
                    if ((char *)ppvVar30[(long)iVar44 + -1] != (char *)0x0) {
                      pAVar15 = Io_ReadCreateNode(p_00->pNtk,(char *)ppvVar30[(long)iVar44 + -1],
                                                  pNamesIn,iVar44 + -4);
                      pMVar23 = Mio_GateReadTwin(pMVar23);
                      (pAVar15->field_5).pData = pMVar23;
                    }
                  }
                  goto LAB_002cfde0;
                }
                pVVar27 = p_00->pMan->vLines;
                pcVar19 = p_00->pMan->sError;
                uVar16 = (ulong)pVVar27->nSize;
                uVar33 = 0xffffffff;
                if ((long)uVar16 < 1) goto LAB_002d1127;
                uVar35 = 0;
                goto LAB_002d1068;
              }
              pVVar27 = p_00->pMan->vLines;
              pcVar19 = p_00->pMan->sError;
              uVar16 = (ulong)pVVar27->nSize;
              uVar33 = 0xffffffff;
              if ((long)uVar16 < 1) goto LAB_002d1111;
              uVar35 = 0;
              goto LAB_002d1025;
            }
            pVVar27 = p_00->pMan->vLines;
            pcVar19 = p_00->pMan->sError;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if ((long)uVar16 < 1) goto LAB_002d1103;
            uVar35 = 0;
            goto LAB_002d0fe2;
          }
          pVVar27 = p_00->pMan->vLines;
          pcVar19 = p_00->pMan->sError;
          uVar16 = (ulong)pVVar27->nSize;
          uVar33 = 0xffffffff;
          if ((long)uVar16 < 1) goto LAB_002d10e7;
          uVar35 = 0;
          goto LAB_002d0f9f;
        }
LAB_002cffaa:
        pVVar27 = p_00->vShorts;
        if (0 < pVVar27->nSize) {
          lVar43 = 0;
          do {
            if (p_00->pMan->fBlifMv != 0) {
              __assert_fail("!p->pMan->fBlifMv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x84e,"int Io_MvParseLineShortBlif(Io_MvMod_t *, char *)");
            }
            pVVar3 = p_00->pMan->vTokens;
            Io_MvSplitIntoTokens(pVVar3,(char *)pVVar27->pArray[lVar43],'\0');
            if (pVVar3->nSize != 3) {
              if (pVVar3->nSize < 1) goto LAB_002d1149;
              pVVar27 = p_00->pMan->vLines;
              pcVar19 = p_00->pMan->sError;
              uVar16 = (ulong)pVVar27->nSize;
              uVar33 = 0xffffffff;
              if ((long)uVar16 < 1) goto LAB_002d10f5;
              uVar35 = 0;
              goto LAB_002d0e8d;
            }
            ppvVar30 = pVVar3->pArray;
            iVar44 = strcmp((char *)*ppvVar30,"short");
            if (iVar44 != 0) {
              __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"short\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x856,"int Io_MvParseLineShortBlif(Io_MvMod_t *, char *)");
            }
            pcVar18 = (char *)ppvVar30[2];
            pAVar15 = Abc_NtkFindOrCreateNet(p_00->pNtk,pcVar18);
            if (0 < (pAVar15->vFanins).nSize) {
              pVVar27 = p_00->pMan->vLines;
              pcVar19 = p_00->pMan->sError;
              uVar16 = (ulong)pVVar27->nSize;
              uVar33 = 0xffffffff;
              if ((long)uVar16 < 1) goto LAB_002d0f67;
              uVar35 = 0;
              goto LAB_002d0ecb;
            }
            pAVar15 = Io_ReadCreateNode(p_00->pNtk,pcVar18,(char **)(pVVar3->pArray + 1),1);
            if (p_00->pNtk->ntkFunc == ABC_FUNC_MAP) {
              pMVar22 = (Mio_Library_t *)Abc_FrameReadLibGen();
              if (pMVar22 == (Mio_Library_t *)0x0) {
                pVVar27 = p_00->pMan->vLines;
                pcVar19 = p_00->pMan->sError;
                uVar16 = (ulong)pVVar27->nSize;
                uVar33 = 0xffffffff;
                if ((long)uVar16 < 1) goto LAB_002d10e7;
                uVar35 = 0;
                goto LAB_002d10a2;
              }
              pMVar23 = Mio_LibraryReadBuf(pMVar22);
              if (pMVar23 == (Mio_Gate_t *)0x0) {
                pVVar27 = p_00->pMan->vLines;
                pcVar19 = p_00->pMan->sError;
                uVar16 = (ulong)pVVar27->nSize;
                uVar33 = 0xffffffff;
                if ((long)uVar16 < 1) goto LAB_002d113d;
                uVar35 = 0;
                goto LAB_002d10d5;
              }
            }
            else {
              pMVar23 = (Mio_Gate_t *)Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc,"1 1\n");
            }
            (pAVar15->field_5).pData = pMVar23;
            lVar43 = lVar43 + 1;
            pVVar27 = p_00->vShorts;
          } while (lVar43 < pVVar27->nSize);
        }
      }
      else if (0 < pVVar27->nSize) {
        lVar43 = 0;
        do {
          iVar44 = Io_MvParseLineNamesMv(p_00,(char *)pVVar27->pArray[lVar43],0);
          if (iVar44 == 0) {
            return (Abc_Des_t *)0x0;
          }
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vNames;
        } while (lVar43 < pVVar27->nSize);
      }
      pVVar27 = p_00->vSubckts;
      if (0 < pVVar27->nSize) {
        lVar43 = 0;
        do {
          pbVar34 = (byte *)pVVar27->pArray[lVar43];
          bVar31 = *pbVar34;
          if (bVar31 == 0) {
            iVar44 = 0;
          }
          else {
            iVar44 = 0;
            pbVar14 = pbVar34;
            do {
              pbVar14 = pbVar14 + 1;
              iVar44 = iVar44 + (uint)(bVar31 == 0x3d);
              bVar31 = *pbVar14;
            } while (bVar31 != 0);
          }
          pVVar27 = p_00->pMan->vTokens;
          pbVar14 = pbVar34;
LAB_002d00f0:
          uVar16 = (ulong)*pbVar14;
          if (0x20 < uVar16) {
LAB_002d011a:
            bVar31 = 0;
LAB_002d0101:
            if (!(bool)(*pbVar14 != 0x3d & (bVar31 ^ 1))) {
              *pbVar14 = 0;
            }
            pbVar14 = pbVar14 + 1;
            goto LAB_002d00f0;
          }
          bVar31 = 1;
          if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_002d0101;
          if (uVar16 != 0) goto LAB_002d011a;
          Io_MvCollectTokens(pVVar27,(char *)pbVar34,(char *)pbVar14);
          iVar11 = pVVar27->nSize;
          if (iVar11 < 1) goto LAB_002d1149;
          ppvVar30 = pVVar27->pArray;
          iVar9 = strcmp((char *)*ppvVar30,"subckt");
          if (iVar9 != 0) {
            __assert_fail("!strcmp(pToken, \"subckt\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x550,"int Io_MvParseLineSubckt(Io_MvMod_t *, char *)");
          }
          if (iVar11 == 1) goto LAB_002d1149;
          pcVar18 = (char *)ppvVar30[1];
          for (pcVar19 = pcVar18; *pcVar19 != '\0'; pcVar19 = pcVar19 + 1) {
            if (*pcVar19 == '|') {
              *pcVar19 = '\0';
              break;
            }
          }
          pAVar24 = Abc_DesFindModelByName(p_00->pMan->pDesign,pcVar18);
          if (pAVar24 == (Abc_Ntk_t *)0x0) {
            pVVar27 = p_00->pMan->vLines;
            uVar16 = (ulong)pVVar27->nSize;
            uVar33 = 0xffffffff;
            if (0 < (long)uVar16) {
              uVar35 = 0;
              do {
                if (pcVar19 < pVVar27->pArray[uVar35]) {
                  uVar33 = uVar35 & 0xffffffff;
                  break;
                }
                uVar35 = uVar35 + 1;
              } while (uVar16 != uVar35);
            }
            sprintf(p_00->pMan->sError,"Line %d: Cannot find the model for subcircuit %s.",uVar33,
                    pcVar18);
          }
          else {
            ppvVar30 = pVVar27->pArray;
            lVar39 = (long)p_00->pMan->fBlifMv;
            pAVar15 = Abc_NtkCreateObj(p_00->pNtk,
                                       (pAVar24->ntkFunc == ABC_FUNC_BLACKBOX) + ABC_OBJ_WHITEBOX);
            (pAVar15->field_5).pData = pAVar24;
            if (p_00->pMan->fBlifMv != 0) {
              if (pVVar27->nSize < 3) goto LAB_002d1149;
              Abc_ObjAssignName(pAVar15,(char *)pVVar27->pArray[2],(char *)0x0);
            }
            pVVar27 = pAVar24->vPis;
            if (0 < pVVar27->nSize) {
              lVar40 = 0;
              iVar11 = 0;
              do {
                pcVar18 = Abc_ObjName(*(Abc_Obj_t **)
                                       (*(long *)(*(long *)(*pVVar27->pArray[lVar40] + 0x20) + 8) +
                                       (long)**(int **)((long)pVVar27->pArray[lVar40] + 0x30) * 8));
                if (0 < iVar44) {
                  iVar9 = 0;
                  do {
                    uVar10 = ((iVar11 + iVar9) % iVar44) * 2;
                    iVar13 = strcmp((char *)ppvVar30[lVar39 + (long)(int)uVar10 + 2],pcVar18);
                    if (iVar13 == 0) {
                      pcVar18 = (char *)ppvVar30[lVar39 + (long)(int)(uVar10 | 1) + 2];
                      iVar11 = iVar11 + iVar9 + 1;
                      goto LAB_002d0290;
                    }
                    iVar9 = iVar9 + 1;
                  } while (iVar44 != iVar9);
                }
                pcVar18 = (char *)0x0;
LAB_002d0290:
                if (pcVar18 == (char *)0x0) {
                  pAVar26 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_NODE);
                  pcVar18 = Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc," 0\n");
                  (pAVar26->field_5).pData = pcVar18;
                  pAVar5 = p_00->pNtk;
                  pcVar18 = Abc_ObjNameSuffix(pAVar26,"abc");
                  pAVar25 = Abc_NtkFindOrCreateNet(pAVar5,pcVar18);
                  Abc_ObjAddFanin(pAVar25,pAVar26);
                }
                else {
                  pAVar25 = Abc_NtkFindOrCreateNet(p_00->pNtk,pcVar18);
                }
                pAVar26 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_BI);
                Abc_ObjAddFanin(pAVar15,pAVar26);
                Abc_ObjAddFanin(pAVar26,pAVar25);
                lVar40 = lVar40 + 1;
                pVVar27 = pAVar24->vPis;
              } while (lVar40 < pVVar27->nSize);
            }
            pVVar27 = pAVar24->vPos;
            if (0 < pVVar27->nSize) {
              lVar40 = 0;
              iVar11 = 0;
              do {
                pcVar18 = Abc_ObjName(*(Abc_Obj_t **)
                                       (*(long *)(*(long *)(*pVVar27->pArray[lVar40] + 0x20) + 8) +
                                       (long)**(int **)((long)pVVar27->pArray[lVar40] + 0x20) * 8));
                if (0 < iVar44) {
                  iVar9 = 0;
                  do {
                    uVar10 = ((iVar11 + iVar9) % iVar44) * 2;
                    iVar13 = strcmp((char *)ppvVar30[lVar39 + (long)(int)uVar10 + 2],pcVar18);
                    if (iVar13 == 0) {
                      pcVar18 = (char *)ppvVar30[lVar39 + (long)(int)(uVar10 | 1) + 2];
                      iVar11 = iVar11 + iVar9 + 1;
                      goto LAB_002d03c9;
                    }
                    iVar9 = iVar9 + 1;
                  } while (iVar44 != iVar9);
                }
                pcVar18 = (char *)0x0;
LAB_002d03c9:
                pAVar25 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_BO);
                pAVar5 = p_00->pNtk;
                if (pcVar18 == (char *)0x0) {
                  pcVar18 = Abc_ObjNameSuffix(pAVar25,"abc");
                }
                pAVar26 = Abc_NtkFindOrCreateNet(pAVar5,pcVar18);
                Abc_ObjAddFanin(pAVar26,pAVar25);
                Abc_ObjAddFanin(pAVar25,pAVar15);
                lVar40 = lVar40 + 1;
                pVVar27 = pAVar24->vPos;
              } while (lVar40 < pVVar27->nSize);
            }
          }
          if (pAVar24 == (Abc_Ntk_t *)0x0) {
            return (Abc_Des_t *)0x0;
          }
          lVar43 = lVar43 + 1;
          pVVar27 = p_00->vSubckts;
        } while (lVar43 < pVVar27->nSize);
      }
      pAVar24 = p_00->pNtk;
      if ((((pAVar24->nObjCounts[8] == 0) && (pAVar24->nObjCounts[7] == 0)) &&
          (pAVar24->vBoxes->nSize == 0)) && (pAVar24->ntkFunc == ABC_FUNC_SOP)) {
        Mem_FlexStop((Mem_Flex_t *)pAVar24->pManFunc,0);
        pAVar24 = p_00->pNtk;
        pAVar24->pManFunc = (void *)0x0;
        pAVar24->ntkFunc = ABC_FUNC_BLACKBOX;
      }
      Abc_NtkFinalizeRead(p_00->pNtk);
      iVar44 = p_00->vOnehots->nSize;
      if (0 < iVar44) {
        pVVar27 = p_00->pNtk->vBoxes;
        lVar43 = (long)pVVar27->nSize;
        if (0 < lVar43) {
          ppvVar30 = pVVar27->pArray;
          lVar39 = 0;
          do {
            pvVar29 = ppvVar30[lVar39];
            if ((*(uint *)((long)pvVar29 + 0x14) & 0xf) == 8) {
              *(long *)((long)pvVar29 + 8) = lVar39;
            }
            lVar39 = lVar39 + 1;
          } while (lVar43 != lVar39);
        }
        pVVar27 = Vec_PtrAlloc(iVar44);
        p_00->pNtk->vOnehots = pVVar27;
        pVVar27 = p_00->vOnehots;
        bVar45 = 0 < pVVar27->nSize;
        if (0 < pVVar27->nSize) {
          lVar43 = 0;
LAB_002d057c:
          pbVar34 = (byte *)pVVar27->pArray[lVar43];
          pVVar27 = p_00->pMan->vTokens;
          pbVar14 = pbVar34;
LAB_002d0597:
          uVar16 = (ulong)*pbVar14;
          if (0x20 < uVar16) {
LAB_002d05c1:
            bVar31 = 0;
LAB_002d05a8:
            if (!(bool)(*pbVar14 != 0x3d & (bVar31 ^ 1))) {
              *pbVar14 = 0;
            }
            pbVar14 = pbVar14 + 1;
            goto LAB_002d0597;
          }
          bVar31 = 1;
          if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_002d05a8;
          if (uVar16 != 0) goto LAB_002d05c1;
          Io_MvCollectTokens(pVVar27,(char *)pbVar34,(char *)pbVar14);
          uVar10 = pVVar27->nSize;
          if (0 < (int)uVar10) {
            iVar44 = strcmp((char *)*pVVar27->pArray,"onehot");
            if (iVar44 != 0) {
              __assert_fail("!strcmp(pToken, \"onehot\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x5d8,"Vec_Int_t *Io_MvParseLineOnehot(Io_MvMod_t *, char *)");
            }
            puVar28 = (uint *)malloc(0x10);
            uVar16 = 0x10;
            if (0x10 < uVar10) {
              uVar16 = (ulong)uVar10;
            }
            puVar28[1] = 0;
            *puVar28 = (uint)uVar16;
            pvVar29 = malloc(uVar16 << 2);
            *(void **)(puVar28 + 2) = pvVar29;
            if (uVar10 != 1) {
              lVar39 = 1;
              do {
                pcVar18 = (char *)pVVar27->pArray[lVar39];
                pAVar15 = Abc_NtkFindNet(p_00->pNtk,pcVar18);
                if (pAVar15 == (Abc_Obj_t *)0x0) {
                  pIVar7 = p_00->pMan;
                  uVar16 = (ulong)pIVar7->vLines->nSize;
                  uVar33 = 0xffffffff;
                  if ((long)uVar16 < 1) goto LAB_002d0838;
                  uVar35 = 0;
                  goto LAB_002d0806;
                }
                plVar6 = (long *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                if (((plVar6 == (long *)0x0) ||
                    (lVar40 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                       (long)*(int *)plVar6[4] * 8), lVar40 == 0)) ||
                   ((*(uint *)(lVar40 + 0x14) & 0xf) != 8)) {
                  pIVar7 = p_00->pMan;
                  uVar16 = (ulong)pIVar7->vLines->nSize;
                  uVar33 = 0xffffffff;
                  if ((long)uVar16 < 1) goto LAB_002d0818;
                  uVar35 = 0;
                  goto LAB_002d07c7;
                }
                uVar1 = *(undefined4 *)(lVar40 + 8);
                uVar10 = puVar28[1];
                uVar32 = *puVar28;
                if (uVar10 == uVar32) {
                  if ((int)uVar32 < 0x10) {
                    if (*(void **)(puVar28 + 2) == (void *)0x0) {
                      pvVar29 = malloc(0x40);
                    }
                    else {
                      pvVar29 = realloc(*(void **)(puVar28 + 2),0x40);
                    }
                    *(void **)(puVar28 + 2) = pvVar29;
                    uVar38 = 0x10;
                  }
                  else {
                    uVar38 = uVar32 * 2;
                    if ((int)uVar38 <= (int)uVar32) goto LAB_002d073d;
                    if (*(void **)(puVar28 + 2) == (void *)0x0) {
                      pvVar29 = malloc((ulong)uVar32 << 3);
                    }
                    else {
                      pvVar29 = realloc(*(void **)(puVar28 + 2),(ulong)uVar32 << 3);
                    }
                    *(void **)(puVar28 + 2) = pvVar29;
                  }
                  if (pvVar29 == (void *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  *puVar28 = uVar38;
                }
LAB_002d073d:
                puVar28[1] = uVar10 + 1;
                *(undefined4 *)(*(long *)(puVar28 + 2) + (long)(int)uVar10 * 4) = uVar1;
                printf("%d");
                lVar39 = lVar39 + 1;
              } while (lVar39 < pVVar27->nSize);
            }
            putchar(10);
            goto LAB_002d0858;
          }
          goto LAB_002d1149;
        }
LAB_002d0906:
        pAVar24 = p_00->pNtk;
        pVVar27 = pAVar24->vBoxes;
        lVar43 = (long)pVVar27->nSize;
        if (0 < lVar43) {
          ppvVar30 = pVVar27->pArray;
          lVar39 = 0;
          do {
            pvVar29 = ppvVar30[lVar39];
            if ((*(uint *)((long)pvVar29 + 0x14) & 0xf) == 8) {
              *(undefined8 *)((long)pvVar29 + 8) = 0;
            }
            lVar39 = lVar39 + 1;
          } while (lVar43 != lVar39);
        }
        printf("Parsed %d groups of 1-hot registers: { ",(ulong)(uint)pAVar24->vOnehots->nSize);
        pVVar27 = p_00->pNtk->vOnehots;
        if (0 < pVVar27->nSize) {
          lVar43 = 0;
          do {
            printf("%d ",(ulong)*(uint *)((long)pVVar27->pArray[lVar43] + 4));
            lVar43 = lVar43 + 1;
            pVVar27 = p_00->pNtk->vOnehots;
          } while (lVar43 < pVVar27->nSize);
        }
        puts("}");
        pVVar27 = p_00->pNtk->vOnehots;
        lVar43 = (long)pVVar27->nSize;
        if (lVar43 < 1) {
          uVar16 = 0;
        }
        else {
          lVar39 = 0;
          uVar16 = 0;
          do {
            uVar16 = (ulong)(uint)((int)uVar16 + *(int *)((long)pVVar27->pArray[lVar39] + 4));
            lVar39 = lVar39 + 1;
          } while (lVar43 != lVar39);
        }
        if (pVVar27->nSize < 1) {
          dVar48 = 0.0;
        }
        else {
          lVar39 = 0;
          iVar44 = 0;
          do {
            iVar44 = iVar44 + *(int *)((long)pVVar27->pArray[lVar39] + 4);
            lVar39 = lVar39 + 1;
          } while (lVar43 != lVar39);
          dVar48 = (double)iVar44 * 100.0;
        }
        printf("The total number of 1-hot registers = %d. (%.2f %%)\n",
               dVar48 / (double)p_00->pNtk->nObjCounts[8],uVar16);
        pcVar18 = Extra_FileNameGenericAppend(p_00->pMan->pFileName,"_1h.blif");
        pAVar24 = p_00->pNtk;
        Abc_GenOneHotIntervals
                  (pcVar18,pAVar24->vPis->nSize,pAVar24->nObjCounts[8],pAVar24->vOnehots);
        printf("One-hotness condition is written into file \"%s\".\n",pcVar18);
LAB_002d0a6d:
        if (bVar45) {
          return (Abc_Des_t *)0x0;
        }
      }
      if (p_00->vFlops->nSize != 0) {
        printf("Warning: The parser converted %d .flop lines into .latch lines\n");
        puts("(information about set, reset, enable of the flops may be lost).");
      }
      lVar41 = lVar41 + 1;
      pVVar27 = p->vModels;
    } while (lVar41 < pVVar27->nSize);
  }
  if (p->nNDnodes != 0) {
    printf("Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n");
  }
  pAVar8 = p->pDesign;
  p->pDesign = (Abc_Des_t *)0x0;
  return pAVar8;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0c36:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0d39:
  pcVar18 = "Line %d: The number of values in not specified in .mv line.";
  goto LAB_002d0d40;
  while (uVar46 = uVar46 + 1, uVar33 != uVar46) {
LAB_002d0c79:
    if (pcVar18 < pIVar7->vLines->pArray[uVar46]) {
      uVar35 = uVar46 & 0xffffffff;
      break;
    }
  }
LAB_002d0d4b:
  pcVar18 = "Line %d: The number of values (%d) is incorrect (should be >= 2 and <= %d).";
  uVar46 = 0x100;
  uVar33 = uVar16;
  goto LAB_002d0db4;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0b23:
    if (*pVVar27->pArray < pVVar3->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0b35:
  pcVar42 = "Line %d: Symbolic value name \"%s\" is repeated in .mv line.";
  goto LAB_002d0b3f;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0b72:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0cd5:
  pcVar18 = "Line %d: Cannot find flop output.";
  goto LAB_002d0d40;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0bb0:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0ce0:
  pcVar18 = "Line %d: Cannot find flop input.";
  goto LAB_002d0d40;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0d15:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0e48:
  pcVar42 = "Line %d: Cannot read flop init value %s.";
  goto LAB_002d0b3f;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0bf3:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0d2e:
  pcVar18 = "Line %d: Latch does not have input name and output name.";
  goto LAB_002d0d40;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0def:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0f25:
  if (iVar44 < 4) {
LAB_002d1149:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar19 = p_00->pMan->sError;
  pcVar18 = (char *)pVVar3->pArray[3];
  pcVar42 = "Line %d: Initial state of the latch is incorrect \"%s\".";
  goto LAB_002d0b3f;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002cfea7:
    if (pbVar14 < pIVar7->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002cff49:
  pcVar18 = "Line %d: Cube \"%s\" has size different from the fanin count (%d).";
  goto LAB_002cff9e;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002cfe36:
    if (pbVar14 < pIVar7->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002cff2a:
  pcVar18 = "Line %d: Output value \"%s\" is incorrect.";
LAB_002cfd9c:
  sprintf(pIVar7->sError,pcVar18,uVar33,pbVar34);
  goto LAB_002cfdba;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002cfeec:
    if (pbVar14 < pIVar7->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002cff8b:
  pcVar18 = 
  "Line %d: Output value \"%s\" differs from the value in the first line of the table (%d).";
  pbVar14 = pbVar34;
LAB_002cff9e:
  sprintf(pIVar7->sError,pcVar18,uVar33,pbVar14);
LAB_002cfdba:
  pcVar18 = (char *)0x0;
LAB_002cfdbc:
  (pAVar15->field_5).pData = pcVar18;
  if (pcVar18 == (char *)0x0) {
    return (Abc_Des_t *)0x0;
  }
  pcVar18 = Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc,pcVar18);
  (pAVar15->field_5).pData = pcVar18;
LAB_002cfde0:
  lVar43 = lVar43 + 1;
  pVVar27 = p_00->vNames;
  if (pVVar27->nSize <= lVar43) goto LAB_002cffaa;
  goto LAB_002cf6b5;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0f13:
    if (pcVar18 < pVVar27->pArray[uVar35]) goto LAB_002d0f65;
  }
  goto LAB_002d0f67;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0d8e:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0ee4:
  pcVar18 = "Line %d: Invalid gate input assignment.";
  goto LAB_002d0d40;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d1068:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d1127:
  pcVar18 = (char *)pVVar3->pArray[1];
  pcVar42 = "Line %d: Mismatch in the fanins of gate \"%s\".";
  goto LAB_002d0b3f;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d1025:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d1111:
  pcVar18 = (char *)pVVar3->pArray[1];
  pcVar42 = "Line %d: Cannot find gate \"%s\" in the library.";
  goto LAB_002d0b3f;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0fe2:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d1103:
  pcVar18 = "Line %d: The .gate line has less than two tokens.";
  goto LAB_002d0d40;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0f9f:
    if (pcVar18 < pVVar27->pArray[uVar35]) goto LAB_002d10e5;
  }
  goto LAB_002d10e7;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0e8d:
    if (*pVVar3->pArray < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d10f5:
  pcVar18 = "Line %d: Expecting three entries in the .short line.";
  goto LAB_002d0d40;
LAB_002d0f65:
  uVar33 = uVar35 & 0xffffffff;
  goto LAB_002d0f67;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d10a2:
    if (pcVar18 < pVVar27->pArray[uVar35]) goto LAB_002d10e5;
  }
LAB_002d10e7:
  pcVar18 = "Line %d: The current library is not available.";
  goto LAB_002d0d40;
LAB_002d10e5:
  uVar33 = uVar35 & 0xffffffff;
  goto LAB_002d10e7;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0806:
    if (pcVar18 < pIVar7->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0838:
  pcVar19 = "Line %d: Signal with name \"%s\" does not exist in the model \"%s\".";
  goto LAB_002d084b;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d07c7:
    if (pcVar18 < pIVar7->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0818:
  pcVar19 = "Line %d: Signal with name \"%s\" is not a register in the model \"%s\".";
LAB_002d084b:
  sprintf(pIVar7->sError,pcVar19,uVar33,pcVar18);
  puVar28 = (uint *)0x0;
LAB_002d0858:
  if (puVar28 == (uint *)0x0) goto LAB_002d0a6d;
  pVVar27 = p_00->pNtk->vOnehots;
  uVar10 = pVVar27->nCap;
  if (pVVar27->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (pVVar27->pArray == (void **)0x0) {
        ppvVar30 = (void **)malloc(0x80);
      }
      else {
        ppvVar30 = (void **)realloc(pVVar27->pArray,0x80);
      }
      pVVar27->pArray = ppvVar30;
      iVar44 = 0x10;
    }
    else {
      iVar44 = uVar10 * 2;
      if (iVar44 <= (int)uVar10) goto LAB_002d08d7;
      if (pVVar27->pArray == (void **)0x0) {
        ppvVar30 = (void **)malloc((ulong)uVar10 << 4);
      }
      else {
        ppvVar30 = (void **)realloc(pVVar27->pArray,(ulong)uVar10 << 4);
      }
      pVVar27->pArray = ppvVar30;
    }
    pVVar27->nCap = iVar44;
  }
LAB_002d08d7:
  iVar44 = pVVar27->nSize;
  pVVar27->nSize = iVar44 + 1;
  pVVar27->pArray[iVar44] = puVar28;
  lVar43 = lVar43 + 1;
  pVVar27 = p_00->vOnehots;
  bVar45 = lVar43 < pVVar27->nSize;
  if (pVVar27->nSize <= lVar43) goto LAB_002d0906;
  goto LAB_002d057c;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d10d5:
    if (pcVar18 < pVVar27->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d113d:
  pcVar18 = "Line %d: Cannot find buffer gate in the library.";
LAB_002d0d40:
  sprintf(pcVar19,pcVar18,uVar33);
  return (Abc_Des_t *)0x0;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0ecb:
    if (pcVar18 < pVVar27->pArray[uVar35]) goto LAB_002d0f65;
  }
LAB_002d0f67:
  pcVar42 = "Line %d: Signal \"%s\" is defined more than once.";
LAB_002d0b3f:
  sprintf(pcVar19,pcVar42,uVar33,pcVar18);
  return (Abc_Des_t *)0x0;
  while (uVar46 = uVar46 + 1, uVar33 != uVar46) {
LAB_002d0cbc:
    if (pcVar18 < pIVar7->vLines->pArray[uVar46]) {
      uVar35 = uVar46 & 0xffffffff;
      break;
    }
  }
LAB_002d0da7:
  pcVar18 = "Line %d: Wrong number (%d) of symbolic value names (should be %d).";
  uVar33 = (ulong)uVar32;
  uVar46 = uVar16;
LAB_002d0db4:
  sprintf(pIVar7->sError,pcVar18,uVar35,uVar33,uVar46);
  return (Abc_Des_t *)0x0;
  while (uVar35 = uVar35 + 1, uVar16 != uVar35) {
LAB_002d0e2f:
    if (p_00->pName < p->vLines->pArray[uVar35]) {
      uVar33 = uVar35 & 0xffffffff;
      break;
    }
  }
LAB_002d0f4a:
  sprintf(p->sError,"Line %d: Model %s has different number of latches (%d) and reset nodes (%d).",
          uVar33,p_00->pNtk->pName);
  return (Abc_Des_t *)0x0;
}

Assistant:

static Abc_Des_t * Io_MvParse( Io_MvMan_t * p )
{
    Abc_Des_t * pDesign;
    Io_MvMod_t * pMod;
    char * pLine;
    int i, k;
    // iterate through the models
    Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
    { 
#ifdef IO_VERBOSE_OUTPUT
        if ( Vec_PtrSize(p->vModels) > 1 )
            printf( "Parsing model %s...\n", pMod->pNtk->pName );
#endif

        // check if there any MV lines
        if ( Vec_PtrSize(pMod->vMvs) > 0 )
            Abc_NtkStartMvVars( pMod->pNtk );
        // parse the mv lines
        Vec_PtrForEachEntry( char *, pMod->vMvs, pLine, k )
            if ( !Io_MvParseLineMv( pMod, pLine ) )
                return NULL;
        // if reset lines are used there should be the same number of them as latches
        if ( Vec_PtrSize(pMod->vResets) > 0 )
        {
            if ( Vec_PtrSize(pMod->vLatches) != Vec_PtrSize(pMod->vResets) )
            {
                sprintf( p->sError, "Line %d: Model %s has different number of latches (%d) and reset nodes (%d).", 
                    Io_MvGetLine(p, pMod->pName), Abc_NtkName(pMod->pNtk), Vec_PtrSize(pMod->vLatches), Vec_PtrSize(pMod->vResets) );
                return NULL;
            }
            // create binary latch with 1-data and 0-init
            if ( p->fUseReset ) 
                pMod->pResetLatch = Io_ReadCreateResetLatch( pMod->pNtk, p->fBlifMv );
        }
        // parse the flops
        Vec_PtrForEachEntry( char *, pMod->vFlops, pLine, k )
            if ( !Io_MvParseLineFlop( pMod, pLine ) )
                return NULL;
        // parse the latches
        Vec_PtrForEachEntry( char *, pMod->vLatches, pLine, k )
            if ( !Io_MvParseLineLatch( pMod, pLine ) )
                return NULL;
        // parse the reset lines
        if ( p->fUseReset )
            Vec_PtrForEachEntry( char *, pMod->vResets, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 1 ) )
                    return NULL;
        // parse the nodes
        if ( p->fBlifMv )
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 0 ) )
                    return NULL;
        }
        else
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesBlif( pMod, pLine ) )
                    return NULL;
            Vec_PtrForEachEntry( char *, pMod->vShorts, pLine, k )
                if ( !Io_MvParseLineShortBlif( pMod, pLine ) )
                    return NULL;
        }
        // parse the subcircuits
        Vec_PtrForEachEntry( char *, pMod->vSubckts, pLine, k )
            if ( !Io_MvParseLineSubckt( pMod, pLine ) )
                return NULL;

        // allow for blackboxes without .blackbox line
        if ( Abc_NtkLatchNum(pMod->pNtk) == 0 && Abc_NtkNodeNum(pMod->pNtk) == 0 && Abc_NtkBoxNum(pMod->pNtk) == 0 )
        {
            if ( pMod->pNtk->ntkFunc == ABC_FUNC_SOP )
            {
                Mem_FlexStop( (Mem_Flex_t *)pMod->pNtk->pManFunc, 0 );
                pMod->pNtk->pManFunc = NULL;
                pMod->pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            }
        }

        // finalize the network
        Abc_NtkFinalizeRead( pMod->pNtk );
        // read the one-hotness lines
        if ( Vec_PtrSize(pMod->vOnehots) > 0 )
        {
            Vec_Int_t * vLine; 
            Abc_Obj_t * pObj;
            // set register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)k;
            // derive register
            pMod->pNtk->vOnehots = Vec_PtrAlloc( Vec_PtrSize(pMod->vOnehots) );
            Vec_PtrForEachEntry( char *, pMod->vOnehots, pLine, k )
            {
                vLine = Io_MvParseLineOnehot( pMod, pLine );
                if ( vLine == NULL )
                    return NULL;
                Vec_PtrPush( pMod->pNtk->vOnehots, vLine );
//                printf( "Parsed %d one-hot registers.\n", Vec_IntSize(vLine) );
            }
            // reset register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = NULL;
            // print the result
            printf( "Parsed %d groups of 1-hot registers: { ", Vec_PtrSize(pMod->pNtk->vOnehots) );
            Vec_PtrForEachEntry( Vec_Int_t *, pMod->pNtk->vOnehots, vLine, k )
                printf( "%d ", Vec_IntSize(vLine) );
            printf( "}\n" );
            printf( "The total number of 1-hot registers = %d. (%.2f %%)\n", 
                Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ), 
                100.0 * Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ) / Abc_NtkLatchNum(pMod->pNtk) );
            {
                extern void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots );
                char * pFileName = Extra_FileNameGenericAppend( pMod->pMan->pFileName, "_1h.blif" );
                Abc_GenOneHotIntervals( pFileName, Abc_NtkPiNum(pMod->pNtk), Abc_NtkLatchNum(pMod->pNtk), pMod->pNtk->vOnehots );
                printf( "One-hotness condition is written into file \"%s\".\n", pFileName );
            }
        }
        if ( Vec_PtrSize(pMod->vFlops) )
        {
            printf( "Warning: The parser converted %d .flop lines into .latch lines\n", Vec_PtrSize(pMod->vFlops) );
            printf( "(information about set, reset, enable of the flops may be lost).\n" );
        }

    }
    if ( p->nNDnodes )
//        printf( "Warning: The parser added %d PIs to replace non-deterministic nodes.\n", p->nNDnodes );
        printf( "Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n", p->nNDnodes );
    // return the network
    pDesign = p->pDesign;
    p->pDesign = NULL;
    return pDesign;
}